

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O1

int repeat_segment_start(mixed_segment *segment)

{
  long *plVar1;
  
  plVar1 = (long *)segment->data;
  if ((*plVar1 != 0) && (plVar1[1] != 0)) {
    *(undefined4 *)((long)plVar1 + 0x1c) = 0;
    return 1;
  }
  mixed_err(0x16);
  return 0;
}

Assistant:

int repeat_segment_start(struct mixed_segment *segment){
  struct repeat_segment_data *data = (struct repeat_segment_data *)segment->data;
  if (data->in == 0 || data->out == 0) {
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }
  data->buffer_index = 0;
  return 1;
}